

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.h
# Opt level: O2

void __thiscall
InstructionRegVmFinalizeContext::InstructionRegVmFinalizeContext
          (InstructionRegVmFinalizeContext *this,ExpressionContext *ctx,Allocator *allocator)

{
  this->ctx = ctx;
  (this->locations).data = (SynBase **)0x0;
  (this->locations).max = 0;
  (this->locations).count = 0;
  (this->cmds).data = (RegVmCmd *)0x0;
  (this->cmds).max = 0;
  (this->cmds).count = 0;
  (this->constants).data = (uint *)0x0;
  (this->constants).max = 0;
  (this->constants).count = 0;
  (this->regKillInfo).data = (uchar *)0x0;
  (this->regKillInfo).max = 0;
  (this->regKillInfo).count = 0;
  SmallArray<InstructionRegVmFinalizeContext::FixupPoint,_32U>::SmallArray
            (&this->fixupPoints,allocator);
  this->currentFunction = (VmFunction *)0x0;
  this->currentBlock = (VmBlock *)0x0;
  return;
}

Assistant:

InstructionRegVmFinalizeContext(ExpressionContext &ctx, Allocator *allocator): ctx(ctx), fixupPoints(allocator)
	{
		currentFunction = 0;
		currentBlock = 0;
	}